

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall Jupiter::Socket::peekFrom(Socket *this,addrinfo *info)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ssize_t sVar4;
  sockaddr *__s;
  socklen_t local_24;
  int r;
  socklen_t len;
  addrinfo *info_local;
  Socket *this_local;
  
  _r = info;
  info_local = (addrinfo *)this;
  Buffer::clear(&this->m_data->buffer);
  if (_r == (addrinfo *)0x0) {
    iVar1 = this->m_data->rawSock;
    pcVar2 = Buffer::chr_data(&this->m_data->buffer);
    sVar3 = Buffer::capacity(&this->m_data->buffer);
    sVar4 = recvfrom(iVar1,pcVar2,sVar3,2,(sockaddr *)0x0,(socklen_t *)0x0);
    this_local._4_4_ = (int)sVar4;
  }
  else {
    local_24 = _r->ai_addrlen;
    if (local_24 == 0) {
      __s = (sockaddr *)operator_new(0x10);
      memset(__s,0,0x10);
      _r->ai_addr = __s;
      local_24 = 0x10;
    }
    iVar1 = this->m_data->rawSock;
    pcVar2 = Buffer::chr_data(&this->m_data->buffer);
    sVar3 = Buffer::capacity(&this->m_data->buffer);
    sVar4 = recvfrom(iVar1,pcVar2,sVar3,2,(sockaddr *)_r->ai_addr,&local_24);
    this_local._4_4_ = (int)sVar4;
    if (-1 < this_local._4_4_) {
      _r->ai_addrlen = local_24;
      _r->ai_family = (uint)_r->ai_addr->sa_family;
      iVar1 = getProtocol(this);
      _r->ai_protocol = iVar1;
      iVar1 = getType(this);
      _r->ai_socktype = iVar1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Jupiter::Socket::peekFrom(addrinfo *info) {
	m_data->buffer.clear();
	if (info == nullptr)
		return recvfrom(m_data->rawSock, m_data->buffer.chr_data(), m_data->buffer.capacity(), MSG_PEEK, nullptr, nullptr);

	socklen_t len = info->ai_addrlen;
	if (len <= 0) {
		info->ai_addr = new sockaddr();
		len = sizeof(sockaddr);
	}
	int r = recvfrom(m_data->rawSock, m_data->buffer.chr_data(), m_data->buffer.capacity(), MSG_PEEK, info->ai_addr, &len);
	if (r >= 0) {
		info->ai_addrlen = len;
		info->ai_family = info->ai_addr->sa_family;
		info->ai_protocol = Jupiter::Socket::getProtocol();
		info->ai_socktype = Jupiter::Socket::getType();
	}
	return r;
}